

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

bool __thiscall
moira::Moira::execDivlMusashi<(moira::Core)2,(moira::Instr)154,(moira::Mode)9,4>
          (Moira *this,u16 opcode,bool *divByZero)

{
  u32 in_EAX;
  u32 uVar1;
  pair<unsigned_int,_unsigned_int> pVar2;
  uint uVar3;
  uint uVar4;
  u32 divisor;
  u32 ea;
  
  divisor = in_EAX;
  uVar1 = readI<(moira::Core)2,2>(this);
  readOp<(moira::Core)2,(moira::Mode)9,4,0ull>(this,opcode & 7,&ea,&divisor);
  if (divisor == 0) {
    execException<(moira::Core)2>(this,DIVIDE_BY_ZERO,0);
    *divByZero = true;
    return false;
  }
  uVar3 = uVar1 & 7;
  uVar4 = uVar1 >> 0xc & 7;
  prefetch<(moira::Core)2,4ull>(this);
  switch(uVar1 >> 10 & 3) {
  case 0:
    pVar2 = divluMusashi<2>(this,(ulong)*(uint *)((long)&(this->reg).field_3 + (ulong)uVar4 * 4),
                            divisor);
    break;
  case 1:
    pVar2 = divluMusashi<4>(this,CONCAT44(*(undefined4 *)
                                           ((long)&(this->reg).field_3 + (ulong)uVar3 * 4),
                                          *(undefined4 *)
                                           ((long)&(this->reg).field_3 + (ulong)uVar4 * 4)),divisor)
    ;
    goto LAB_002e4144;
  case 2:
    pVar2 = divlsMusashi<2>(this,(ulong)*(uint *)((long)&(this->reg).field_3 + (ulong)uVar4 * 4),
                            divisor);
    break;
  case 3:
    pVar2 = divlsMusashi<4>(this,CONCAT44(*(undefined4 *)
                                           ((long)&(this->reg).field_3 + (ulong)uVar3 * 4),
                                          *(undefined4 *)
                                           ((long)&(this->reg).field_3 + (ulong)uVar4 * 4)),divisor)
    ;
LAB_002e4144:
    if ((this->reg).sr.v != false) {
      return true;
    }
    *(uint *)((long)&(this->reg).field_3 + (ulong)uVar3 * 4) = pVar2.second;
    *(uint *)((long)&(this->reg).field_3 + (ulong)uVar4 * 4) = pVar2.first;
    return true;
  }
  *(uint *)((long)&(this->reg).field_3 + (ulong)uVar3 * 4) = pVar2.second;
  *(uint *)((long)&(this->reg).field_3 + (ulong)uVar4 * 4) = pVar2.first;
  return true;
}

Assistant:

bool
Moira::execDivlMusashi(u16 opcode, bool *divByZero)
{
    u64 dividend;
    u32 ea, divisor;
    u16 ext = (u16)readI<C, Word>();

    int src = _____________xxx(opcode);
    int dh  = _____________xxx(ext);
    int dl  = _xxx____________(ext);

    try {
        readOp<C, M, S>(src, &ea, &divisor);
    } catch(...) {
        // TODO: Change return type from bool to void
        return false;
    }

    if (divisor == 0) {

        execException<C>(M68kException::DIVIDE_BY_ZERO);
        *divByZero = true;
        return false;
    }

    prefetch<C, POLL>();

    switch (____xx__________(ext)) {

        case 0b00:
        {
            dividend = readD(dl);

            auto result = divluMusashi<Word>(dividend, divisor);
            writeD(dh, result.second);
            writeD(dl, result.first);
            break;
        }
        case 0b01:
        {
            dividend = (u64)readD(dh) << 32 | readD(dl);
            auto result = divluMusashi<Long>(dividend, divisor);
            if(!reg.sr.v) {

                writeD(dh, result.second);
                writeD(dl, result.first);
            }
            break;
        }
        case 0b10:
        {
            dividend = readD(dl);
            auto result = divlsMusashi<Word>(dividend, divisor);
            writeD(dh, result.second);
            writeD(dl, result.first);
            break;
        }
        case 0b11:
        {
            dividend = (u64)readD(dh) << 32 | readD(dl);
            auto result = divlsMusashi<Long>(dividend, divisor);

            if(!reg.sr.v) {

                writeD(dh, result.second);
                writeD(dl, result.first);
            }
            break;
        }
    }

    return true;
}